

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonBuilder.cpp
# Opt level: O2

bool __thiscall helics::fileops::JsonMapBuilder::clearComponents(JsonMapBuilder *this,int32_t code)

{
  iterator __position;
  
  __position._M_node =
       (_Base_ptr)(this->missing_components)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)__position._M_node ==
        &(this->missing_components)._M_t._M_impl.super__Rb_tree_header) {
      return false;
    }
    if (*(int *)&__position._M_node[2]._M_parent == code) break;
    __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
  }
  std::
  _Rb_tree<int,std::pair<int_const,std::pair<std::__cxx11::string,int>>,std::_Select1st<std::pair<int_const,std::pair<std::__cxx11::string,int>>>,std::less<int>,std::allocator<std::pair<int_const,std::pair<std::__cxx11::string,int>>>>
  ::erase_abi_cxx11_((_Rb_tree<int,std::pair<int_const,std::pair<std::__cxx11::string,int>>,std::_Select1st<std::pair<int_const,std::pair<std::__cxx11::string,int>>>,std::less<int>,std::allocator<std::pair<int_const,std::pair<std::__cxx11::string,int>>>>
                      *)&this->missing_components,__position);
  return (this->missing_components)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0;
}

Assistant:

bool JsonMapBuilder::clearComponents(int32_t code)
{
    for (auto b = missing_components.begin(); b != missing_components.end(); ++b) {
        if (b->second.second == code) {
            missing_components.erase(b);
            return missing_components.empty();
        }
    }
    return false;
}